

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

_Bool openjtalk_speakToFile(OpenJTalk *oj,char *text,char *file_utf8)

{
  byte bVar1;
  size_t sVar2;
  OpenJTalk *oj_00;
  char *in_RDX;
  char *in_RSI;
  long in_RDI;
  _Bool result;
  FILE *wavfp;
  FILE *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  
  if (in_RDI == 0) {
    g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
  }
  else {
    *(undefined4 *)(in_RDI + 0x678) = 0;
    if ((in_RDX == (char *)0x0) || (in_RSI == (char *)0x0)) {
      *(undefined4 *)(in_RDI + 0x678) = 2;
    }
    else {
      sVar2 = strlen(in_RDX);
      if ((sVar2 != 0) && (sVar2 = strlen(in_RSI), sVar2 != 0)) {
        oj_00 = (OpenJTalk *)fopen(in_RDX,"wb");
        if (oj_00 == (OpenJTalk *)0x0) {
          *(undefined4 *)(in_RDI + 0x678) = 8;
          return false;
        }
        bVar1 = generate_wavFile(oj_00,(char *)CONCAT17(in_stack_ffffffffffffffd7,
                                                        in_stack_ffffffffffffffd0),
                                 in_stack_ffffffffffffffc8);
        fclose((FILE *)oj_00);
        return (_Bool)(bVar1 & 1);
      }
      *(undefined4 *)(in_RDI + 0x678) = 2;
    }
  }
  return false;
}

Assistant:

OPENJTALK_CONVENTION openjtalk_speakToFile(OpenJTalk *oj, const char *text, const char *file_utf8)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return false;
	}

	oj->errorCode = OPENJTALKERROR_NO_ERROR;
	if (file_utf8 == NULL || text == NULL)
	{
		oj->errorCode = OPENJTALKERROR_STRING_IS_NULL_OR_EMPTY;
		return false;
	}
	if (strlen(file_utf8) == 0 || strlen(text) == 0)
	{
		oj->errorCode = OPENJTALKERROR_STRING_IS_NULL_OR_EMPTY;
		return false;
	}
#if defined(_WIN32) && !defined(__CYGWIN__) && !defined(__MINGW32__)
	wchar_t file_utf16[MAX_PATH];
	if (!u8tou16_path(file_utf8, file_utf16))
	{
		return false;
	}
	FILE *wavfp = _wfopen((wchar_t *)file_utf16, u"wb");
#else
	FILE *wavfp = fopen(file_utf8, "wb");
#endif
	if (!wavfp)
	{
		oj->errorCode = OPENJTALKERROR_FILE_OPEN_ERROR;
		return false;
	}
	bool result = generate_wavFile(oj, text, wavfp);
	fclose(wavfp);
	return result;
}